

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CLI::App::remaining_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,App *this,bool recurse)

{
  pointer ppVar1;
  pointer ppAVar2;
  pointer psVar3;
  element_type *peVar4;
  long lVar5;
  ulong uVar6;
  pointer ppAVar7;
  iterator __begin5;
  pointer ppVar8;
  pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *miss;
  pointer __x;
  pointer psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar1 = (this->missing_).
           super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1; ppVar8 = ppVar8 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&ppVar8->second);
  }
  if (recurse) {
    if (this->allow_extras_ == false) {
      psVar3 = (this->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar9 = (this->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar3; psVar9 = psVar9 + 1
          ) {
        peVar4 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar4->name_)._M_string_length == 0) {
          ppVar1 = (peVar4->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar8 = (peVar4->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1;
              ppVar8 = ppVar8 + 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&ppVar8->second);
          }
        }
      }
    }
    ppAVar2 = (this->parsed_subcommands_).
              super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppAVar7 = (this->parsed_subcommands_).
                   super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppAVar7 != ppAVar2; ppAVar7 = ppAVar7 + 1) {
      remaining_abi_cxx11_(&local_48,*ppAVar7,true);
      lVar5 = (long)local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (0 < lVar5) {
        uVar6 = lVar5 + 1;
        __x = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,__x);
          __x = __x + 1;
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::vector<std::string> App::remaining(bool recurse) const {
    std::vector<std::string> miss_list;
    for(const std::pair<detail::Classifier, std::string> &miss : missing_) {
        miss_list.push_back(std::get<1>(miss));
    }
    // Get from a subcommand that may allow extras
    if(recurse) {
        if(!allow_extras_) {
            for(const auto &sub : subcommands_) {
                if(sub->name_.empty() && !sub->missing_.empty()) {
                    for(const std::pair<detail::Classifier, std::string> &miss : sub->missing_) {
                        miss_list.push_back(std::get<1>(miss));
                    }
                }
            }
        }
        // Recurse into subcommands

        for(const App *sub : parsed_subcommands_) {
            std::vector<std::string> output = sub->remaining(recurse);
            std::copy(std::begin(output), std::end(output), std::back_inserter(miss_list));
        }
    }
    return miss_list;
}